

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlUTF8Strpos(xmlChar *utf,int pos)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  int local_1c;
  int ch;
  int pos_local;
  xmlChar *utf_local;
  
  if (utf == (xmlChar *)0x0) {
    utf_local = (xmlChar *)0x0;
  }
  else {
    local_1c = pos;
    _ch = utf;
    if (pos < 0) {
      utf_local = (xmlChar *)0x0;
    }
    else {
      while (iVar3 = local_1c + -1, local_1c != 0) {
        pbVar4 = _ch + 1;
        bVar2 = *_ch;
        if (bVar2 == 0) {
          return (xmlChar *)0x0;
        }
        local_1c = iVar3;
        _ch = pbVar4;
        if ((bVar2 & 0x80) != 0) {
          if ((bVar2 & 0xc0) != 0xc0) {
            return (xmlChar *)0x0;
          }
          while (bVar2 = bVar2 << 1, (bVar2 & 0x80) != 0) {
            bVar1 = *_ch;
            _ch = _ch + 1;
            if ((bVar1 & 0xc0) != 0x80) {
              return (xmlChar *)0x0;
            }
          }
        }
      }
      utf_local = _ch;
    }
  }
  return utf_local;
}

Assistant:

const xmlChar *
xmlUTF8Strpos(const xmlChar *utf, int pos) {
    int ch;

    if (utf == NULL) return(NULL);
    if (pos < 0)
        return(NULL);
    while (pos--) {
        ch = *utf++;
        if (ch == 0)
            return(NULL);
        if ( ch & 0x80 ) {
            /* if not simple ascii, verify proper format */
            if ( (ch & 0xc0) != 0xc0 )
                return(NULL);
            /* then skip over remaining bytes for this char */
            while ( (ch <<= 1) & 0x80 )
                if ( (*utf++ & 0xc0) != 0x80 )
                    return(NULL);
        }
    }
    return((xmlChar *)utf);
}